

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pre-process.c
# Opt level: O2

void preprocessor_line(dmr_C *C,stream *stream,token **line)

{
  token *ptVar1;
  token *ptVar2;
  uint uVar3;
  int iVar4;
  symbol *psVar5;
  token *ptVar6;
  code *pcVar7;
  
  ptVar1 = *line;
  ptVar2 = ptVar1;
  do {
    ptVar6 = ptVar2;
    ptVar2 = ptVar6->next;
  } while (((ptVar2->pos).field_0x2 & 0x10) == 0);
  *line = ptVar2;
  ptVar6->next = &dmrC_eof_token_entry_;
  ptVar1 = ptVar1->next;
  if (ptVar1 == &dmrC_eof_token_entry_) {
    return;
  }
  uVar3 = *(uint *)&ptVar1->pos & 0x3f;
  if (uVar3 == 4) {
    pcVar7 = handle_line;
LAB_0011ea7f:
    if ((stream->dirty == 0) && (stream->dirty = 1, stream->ifndef == (token *)0x0)) {
      stream->protect = (ident *)0x0;
    }
    if (C->false_nesting != 0) goto LAB_0011eab6;
  }
  else {
    if ((uVar3 != 2) ||
       (psVar5 = dmrC_lookup_symbol((ptVar1->field_2).ident,NS_PREPROCESSOR),
       psVar5 == (symbol *)0x0)) {
      pcVar7 = handle_nondirective;
      goto LAB_0011ea7f;
    }
    pcVar7 = (psVar5->field_14).field_1.handler;
    if ((psVar5->field_14).field_1.normal != 0) goto LAB_0011ea7f;
  }
  iVar4 = (*pcVar7)(C,stream,line,ptVar1);
  if (iVar4 == 0) {
    return;
  }
LAB_0011eab6:
  free_preprocessor_line(C,ptVar1);
  return;
}

Assistant:

static void preprocessor_line(struct dmr_C *C, struct stream *stream, struct token **line)
{
	struct token *start = *line, *next;
	struct token **tp = &start->next;

	for (;;) {
		next = *tp;
		if (next->pos.newline)
			break;
		tp = &next->next;
	}
	*line = next;
	*tp = &dmrC_eof_token_entry_;
	handle_preprocessor_line(C, stream, line, start);
}